

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O0

void tommy_trie_init(tommy_trie *trie,tommy_allocator *alloc)

{
  long lVar1;
  long in_FS_OFFSET;
  uint local_24;
  tommy_uint_t i;
  tommy_allocator *alloc_local;
  tommy_trie *trie_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 1) {
    trie->bucket[local_24] = (tommy_trie_node *)0x0;
  }
  trie->count = 0;
  trie->node_count = 0;
  trie->alloc = alloc;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_trie_init(tommy_trie* trie, tommy_allocator* alloc)
{
	tommy_uint_t i;

	for (i = 0; i < TOMMY_TRIE_BUCKET_MAX; ++i)
		trie->bucket[i] = 0;

	trie->count = 0;
	trie->node_count = 0;

	trie->alloc = alloc;
}